

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_mul_mpi(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  short sVar4;
  int iVar5;
  size_t A_limbs;
  size_t B_limbs;
  mbedtls_mpi *X_00;
  mbedtls_mpi *X_01;
  undefined1 local_60 [8];
  mbedtls_mpi TA;
  mbedtls_mpi TB;
  
  TA.p._0_4_ = 1;
  local_60 = (undefined1  [8])0x0;
  TA.s = 0;
  TA.n = 0;
  TA._12_4_ = 0;
  X_00 = A;
  if (X == A) {
    X_00 = (mbedtls_mpi *)local_60;
    iVar5 = mbedtls_mpi_copy(X_00,A);
    if (iVar5 != 0) goto LAB_001e7461;
  }
  X_01 = B;
  if (X == B) {
    X_01 = (mbedtls_mpi *)&TA.s;
    iVar5 = mbedtls_mpi_copy(X_01,B);
    if (iVar5 != 0) goto LAB_001e7461;
  }
  uVar3 = (ulong)X_00->n;
  do {
    A_limbs = uVar3;
    if (A_limbs == 0) {
      bVar2 = true;
      goto LAB_001e73cf;
    }
    uVar3 = A_limbs - 1;
  } while (X_00->p[A_limbs - 1] == 0);
  bVar2 = false;
LAB_001e73cf:
  uVar3 = (ulong)X_01->n;
  do {
    B_limbs = uVar3;
    bVar1 = true;
    if (B_limbs == 0) break;
    uVar3 = B_limbs - 1;
    bVar1 = bVar2;
  } while (X_01->p[B_limbs - 1] == 0);
  iVar5 = mbedtls_mpi_grow(X,A_limbs + B_limbs);
  if ((iVar5 == 0) && (iVar5 = mbedtls_mpi_lset(X,0), iVar5 == 0)) {
    mbedtls_mpi_core_mul(X->p,X_00->p,A_limbs,X_01->p,B_limbs);
    sVar4 = 1;
    if (!bVar1) {
      sVar4 = X_01->s * X_00->s;
    }
    X->s = sVar4;
    iVar5 = 0;
  }
LAB_001e7461:
  mbedtls_mpi_free((mbedtls_mpi *)&TA.s);
  mbedtls_mpi_free((mbedtls_mpi *)local_60);
  return iVar5;
}

Assistant:

int mbedtls_mpi_mul_mpi(mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, j;
    mbedtls_mpi TA, TB;
    int result_is_zero = 0;
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(A != NULL);
    MPI_VALIDATE_RET(B != NULL);

    mbedtls_mpi_init(&TA);
    mbedtls_mpi_init(&TB);

    if (X == A) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&TA, A)); A = &TA;
    }
    if (X == B) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&TB, B)); B = &TB;
    }

    for (i = A->n; i > 0; i--) {
        if (A->p[i - 1] != 0) {
            break;
        }
    }
    if (i == 0) {
        result_is_zero = 1;
    }

    for (j = B->n; j > 0; j--) {
        if (B->p[j - 1] != 0) {
            break;
        }
    }
    if (j == 0) {
        result_is_zero = 1;
    }

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, i + j));
    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(X, 0));

    mbedtls_mpi_core_mul(X->p, A->p, i, B->p, j);

    /* If the result is 0, we don't shortcut the operation, which reduces
     * but does not eliminate side channels leaking the zero-ness. We do
     * need to take care to set the sign bit properly since the library does
     * not fully support an MPI object with a value of 0 and s == -1. */
    if (result_is_zero) {
        X->s = 1;
    } else {
        X->s = A->s * B->s;
    }

cleanup:

    mbedtls_mpi_free(&TB); mbedtls_mpi_free(&TA);

    return ret;
}